

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer-spec.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_1::BinaryWriterSpec::WriteAction(BinaryWriterSpec *this,Action *action)

{
  bool bVar1;
  ActionType AVar2;
  InvokeAction *pIVar3;
  string_view local_38;
  string_view local_28;
  Action *local_18;
  Action *action_local;
  BinaryWriterSpec *this_local;
  
  local_18 = action;
  action_local = (Action *)this;
  WriteKey(this,"action");
  Stream::Writef(this->json_stream_,"{");
  WriteKey(this,"type");
  AVar2 = Action::type(local_18);
  if (AVar2 == Invoke) {
    WriteString(this,"invoke");
  }
  else {
    AVar2 = Action::type(local_18);
    if (AVar2 != Get) {
      __assert_fail("action.type() == ActionType::Get",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/binary-writer-spec.cc"
                    ,0xe5,
                    "void wabt::(anonymous namespace)::BinaryWriterSpec::WriteAction(const Action &)"
                   );
    }
    WriteString(this,"get");
  }
  WriteSeparator(this);
  bVar1 = Var::is_name(&local_18->module_var);
  if (bVar1) {
    WriteKey(this,"module");
    WriteVar(this,&local_18->module_var);
    WriteSeparator(this);
  }
  AVar2 = Action::type(local_18);
  if (AVar2 == Invoke) {
    WriteKey(this,"field");
    string_view::string_view(&local_28,&local_18->name);
    WriteEscapedString(this,local_28);
    WriteSeparator(this);
    WriteKey(this,"args");
    pIVar3 = cast<wabt::InvokeAction,wabt::Action>(local_18);
    WriteConstVector(this,&pIVar3->args);
  }
  else {
    WriteKey(this,"field");
    string_view::string_view(&local_38,&local_18->name);
    WriteEscapedString(this,local_38);
  }
  Stream::Writef(this->json_stream_,"}");
  return;
}

Assistant:

void BinaryWriterSpec::WriteAction(const Action& action) {
  WriteKey("action");
  json_stream_->Writef("{");
  WriteKey("type");
  if (action.type() == ActionType::Invoke) {
    WriteString("invoke");
  } else {
    assert(action.type() == ActionType::Get);
    WriteString("get");
  }
  WriteSeparator();
  if (action.module_var.is_name()) {
    WriteKey("module");
    WriteVar(action.module_var);
    WriteSeparator();
  }
  if (action.type() == ActionType::Invoke) {
    WriteKey("field");
    WriteEscapedString(action.name);
    WriteSeparator();
    WriteKey("args");
    WriteConstVector(cast<InvokeAction>(&action)->args);
  } else {
    WriteKey("field");
    WriteEscapedString(action.name);
  }
  json_stream_->Writef("}");
}